

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

ngx_int_t ngx_http_process_host(ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  ngx_int_t nVar1;
  undefined1 local_40 [8];
  ngx_str_t host;
  ngx_int_t rc;
  ngx_uint_t offset_local;
  ngx_table_elt_t *h_local;
  ngx_http_request_t *r_local;
  
  if ((r->headers_in).host == (ngx_table_elt_t *)0x0) {
    (r->headers_in).host = h;
  }
  local_40 = (undefined1  [8])(h->value).len;
  host.len = (size_t)(h->value).data;
  host.data = (u_char *)ngx_http_validate_host((ngx_str_t *)local_40,r->pool,0);
  if (host.data == (u_char *)0xfffffffffffffffb) {
    if (6 < r->connection->log->log_level) {
      ngx_log_error_core(7,r->connection->log,0,"client sent invalid host header");
    }
    ngx_http_finalize_request(r,400);
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else if (host.data == (u_char *)0xffffffffffffffff) {
    ngx_http_close_request(r,500);
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else if ((r->headers_in).server.len == 0) {
    nVar1 = ngx_http_set_virtual_server(r,(ngx_str_t *)local_40);
    if (nVar1 == -1) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      (r->headers_in).server.len = (size_t)local_40;
      (r->headers_in).server.data = (u_char *)host.len;
      r_local = (ngx_http_request_t *)0x0;
    }
  }
  else {
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_process_host(ngx_http_request_t *r, ngx_table_elt_t *h,
    ngx_uint_t offset)
{
    ngx_int_t  rc;
    ngx_str_t  host;

    if (r->headers_in.host == NULL) {
        r->headers_in.host = h;
    }

    host = h->value;

    rc = ngx_http_validate_host(&host, r->pool, 0);

    if (rc == NGX_DECLINED) {
        ngx_log_error(NGX_LOG_INFO, r->connection->log, 0,
                      "client sent invalid host header");
        ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
        return NGX_ERROR;
    }

    if (rc == NGX_ERROR) {
        ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
        return NGX_ERROR;
    }

    if (r->headers_in.server.len) {
        return NGX_OK;
    }

    if (ngx_http_set_virtual_server(r, &host) == NGX_ERROR) {
        return NGX_ERROR;
    }

    r->headers_in.server = host;

    return NGX_OK;
}